

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          unsigned_long param_2)

{
  size_type sVar1;
  unsigned_long *puVar2;
  my_base *this_00;
  allocator_type *__rhs;
  allocator_traits<std::allocator<unsigned_char>_> local_89;
  undefined1 local_88 [8];
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> v;
  pair<unsigned_long,_unsigned_long> sizes;
  unsigned_long local_48;
  size_t local_40;
  unsigned_long new_capacity;
  bool nothrow_ctor;
  undefined8 uStack_30;
  bool noexcept_movable;
  unsigned_long a;
  unsigned_long s;
  Impl2T<poly::virtual_cloning_policy> *args_local;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this_local;
  
  a = 0x100;
  uStack_30 = 0x40;
  new_capacity._7_1_ = 0;
  new_capacity._6_1_ = 1;
  s = param_2;
  args_local = (Impl2T<poly::virtual_cloning_policy> *)this;
  sVar1 = vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::capacity
                    ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)
                     this);
  local_48 = sVar1 * 2;
  sizes.second = 1;
  puVar2 = Catch::clara::std::max<unsigned_long>(&local_48,&sizes.second);
  local_40 = *puVar2;
  join_0x00000010_0x00000000_ =
       vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
       calculate_storage_size
                 ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)this
                  ,local_40,0x100,0x40);
  this_00 = vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::base
                      ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *
                       )this);
  __rhs = vector_impl::allocator_base<std::allocator<unsigned_char>_>::get_allocator_ref(this_00);
  std::allocator_traits<std::allocator<unsigned_char>_>::select_on_container_copy_construction
            (&local_89,__rhs);
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::vector
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)local_88,
             (allocator_type *)&local_89);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&local_89);
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::init_layout
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)local_88,
             v._align_max,local_40,sizes.first);
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
  push_back_new_elem_w_storage_increase_copy
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)this,
             local_88);
  push_back_new_elem<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
            ((vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *)local_88,s)
  ;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::swap
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)this,
             (vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)local_88)
  ;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::~vector
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)local_88)
  ;
  return;
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}